

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration_C.cpp
# Opt level: O2

void cnip::CConfiguration::extend(Options *cmdLineOpts)

{
  OptionAdder *pOVar1;
  allocator<char> local_609;
  allocator<char> local_608;
  allocator<char> local_607;
  allocator<char> local_606;
  allocator<char> local_605;
  allocator<char> local_604;
  allocator<char> local_603;
  allocator<char> local_602;
  allocator<char> local_601;
  allocator<char> local_600;
  allocator<char> local_5ff;
  allocator<char> local_5fe;
  allocator<char> local_5fd;
  allocator<char> local_5fc;
  allocator<char> local_5fb;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  allocator<char> local_5f8;
  allocator<char> local_5f7;
  allocator<char> local_5f6;
  allocator<char> local_5f5;
  allocator<char> local_5f4;
  allocator<char> local_5f3;
  allocator<char> local_5f2;
  allocator<char> local_5f1;
  allocator<char> local_5f0;
  allocator<char> local_5ef;
  allocator<char> local_5ee;
  allocator<char> local_5ed;
  allocator<char> local_5ec;
  allocator<char> local_5eb;
  allocator<char> local_5ea;
  allocator<char> local_5e9;
  element_type *local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5e0;
  element_type *local_5d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5d0;
  shared_ptr<const_cxxopts::Value> local_5c8;
  element_type *local_5b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5b0;
  shared_ptr<const_cxxopts::Value> local_5a8;
  element_type *local_598;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_590;
  shared_ptr<const_cxxopts::Value> local_588;
  element_type *local_578;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_570;
  shared_ptr<const_cxxopts::Value> local_568;
  element_type *local_558;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_550;
  shared_ptr<const_cxxopts::Value> local_548;
  element_type *local_538;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_530;
  shared_ptr<const_cxxopts::Value> local_528;
  long *local_518;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_510;
  long *local_508;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_500;
  long *local_4f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f0;
  long *local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  long *local_4d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d0;
  element_type *local_4c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4c0;
  shared_ptr<const_cxxopts::Value> local_4b8;
  element_type *local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4a0;
  shared_ptr<const_cxxopts::Value> local_498;
  shared_ptr<const_cxxopts::Value> local_488;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8 [32];
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378 [32];
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8 [32];
  string local_1b8;
  string local_198;
  string local_178;
  string local_158 [32];
  string local_138;
  string local_118;
  string local_f8;
  string local_d8 [32];
  string local_b8;
  string local_98;
  undefined1 local_78 [40];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_5e9);
  cxxopts::Options::add_options((OptionAdder *)local_78,cmdLineOpts,&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"C-compiler",&local_5ea);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Select the compiler.",&local_5eb);
  cxxopts::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"gcc",&local_5ec);
  (**(code **)(*local_4d8 + 0x50))(&local_538,local_4d8,local_d8);
  local_528.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_538;
  local_528.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_530._M_pi;
  local_538 = (element_type *)0x0;
  _Stack_530._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"{gcc,clang}",&local_5ed);
  pOVar1 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_78,&local_98,&local_b8,&local_528,&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"C-std",&local_5ee);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Select the standard.",&local_5ef);
  cxxopts::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"c11",&local_5f0);
  (**(code **)(*local_4e8 + 0x50))(&local_558,local_4e8,local_158);
  local_548.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_558;
  local_548.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_550._M_pi;
  local_558 = (element_type *)0x0;
  _Stack_550._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"{c89,c90,c99,c11,c17}",&local_5f1);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_118,&local_138,&local_548,&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"C-pp-includes",&local_5f2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Preprocess `#include\' directives.",&local_5f3);
  cxxopts::value<bool>();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"false",&local_5f4);
  (**(code **)(*local_4f8 + 0x50))(&local_578,local_4f8,local_1d8);
  local_568.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_578;
  local_568.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_570._M_pi;
  local_578 = (element_type *)0x0;
  _Stack_570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_5f5);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_198,&local_1b8,&local_568,&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"C-I",&local_5f6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,
             "Add directory <dir> to the search path of `#include\' directives.",&local_5f7);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_588.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_598;
  local_588.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_590._M_pi;
  local_598 = (element_type *)0x0;
  _Stack_590._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"<dir>",&local_5f8);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_218,&local_238,&local_588,&local_258);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"C-D",&local_5f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Define macro <name> with <value> (or 1 if <value> omitted).",
             &local_5fa);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_5a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_5b8;
  local_5a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_5b0._M_pi;
  local_5b8 = (element_type *)0x0;
  _Stack_5b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"<name>=<value>",&local_5fb);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_278,&local_298,&local_5a8,&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"C-U",&local_5fc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"Undefine macro <name>.",&local_5fd);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_5c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_5d8;
  local_5c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_5d0._M_pi;
  local_5d8 = (element_type *)0x0;
  _Stack_5d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"<name>",&local_5fe);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_2d8,&local_2f8,&local_5c8,&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"C-comment-mode",&local_5ff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,
             "Select the comment mode: D=discard, KA=keep all, KOD=keep only documentation",
             &local_600);
  cxxopts::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>(local_378,"D",&local_601);
  (**(code **)(*local_508 + 0x50))(&local_5e8,local_508,local_378);
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_5e8;
  local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_5e0._M_pi;
  local_5e8 = (element_type *)0x0;
  _Stack_5e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"{D,KA,KOD}",&local_602);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_338,&local_358,&local_488,&local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"C-ambiguity-mode",&local_603);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,
             "Select the ambiguity mode: D=diagnose, DA=disambiguate algorithmically, DAH=disambiguate algorithmically and heuristically, DH=disambiguate heuristically."
             ,&local_604);
  cxxopts::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"DAH",&local_605);
  (**(code **)(*local_518 + 0x50))(&local_4a8,local_518,local_3f8);
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4a8;
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4a0._M_pi;
  local_4a8 = (element_type *)0x0;
  _Stack_4a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"{D,DA,DAH,DH}",&local_606);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_3b8,&local_3d8,&local_498,&local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"C-infer-types",&local_607);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"Infer missing types.",&local_608);
  cxxopts::value<bool>();
  local_4b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4c8;
  local_4b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4c0._M_pi;
  local_4c8 = (element_type *)0x0;
  _Stack_4c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"",&local_609);
  cxxopts::OptionAdder::operator()(pOVar1,&local_438,&local_458,&local_4b8,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4c0);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4a0);
  std::__cxx11::string::~string(local_3f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_510);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_488.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5e0);
  std::__cxx11::string::~string(local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_500);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_318);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5d0);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5b0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_588.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_590);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_568.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_570);
  std::__cxx11::string::~string(local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4f0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_548.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_550);
  std::__cxx11::string::~string(local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e0);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_528.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_530);
  std::__cxx11::string::~string(local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CConfiguration::extend(cxxopts::Options& cmdLineOpts)
{
    cmdLineOpts.add_options()

        /* Compiler */
            (kCompiler,
                "Select the compiler.",
                cxxopts::value<std::string>()->default_value("gcc"),
                "{gcc,clang}")

        /* Language */
            // https://gcc.gnu.org/onlinedocs/gcc/C-Dialect-Options.html#C-Dialect-Options
            (kStd,
                "Select the standard.",
                cxxopts::value<std::string>()->default_value("c11"),
                "{c89,c90,c99,c11,c17}")

        /* Preprocessor */
            (kPPInclude,
                "Preprocess `#include' directives.",
                cxxopts::value<bool>()->default_value("false"))

            // https://gcc.gnu.org/onlinedocs/gcc/Directory-Options.html
            (kSearchPaths,
                "Add directory <dir> to the search path of `#include' directives.",
                cxxopts::value<std::vector<std::string>>(),
                "<dir>")

            // https://gcc.gnu.org/onlinedocs/gcc/Preprocessor-Options.html
            (kDefinedMacros,
                "Define macro <name> with <value> (or 1 if <value> omitted).",
                cxxopts::value<std::vector<std::string>>(),
                "<name>=<value>")
            (KUndefedMacros,
                "Undefine macro <name>.",
                cxxopts::value<std::vector<std::string>>(),
                "<name>")

        /* Parser */
            (kCommentMode,
                "Select the comment mode: "
                "D=discard, "
                "KA=keep all, "
                "KOD=keep only documentation",
                cxxopts::value<std::string>()
                    ->default_value("D"),
                "{D,KA,KOD}")

            (kAmbigMode,
                "Select the ambiguity mode: "
                "D=diagnose, "
                "DA=disambiguate algorithmically, "
                "DAH=disambiguate algorithmically and heuristically, "
                "DH=disambiguate heuristically.",
                cxxopts::value<std::string>()
                    ->default_value("DAH"),
                "{D,DA,DAH,DH}")

        /* Type inference */
            ("C-infer-types", "Infer missing types.")

        ;
//            ("o,output", "Specify output file",
//                cxxopts::value<std::string>()->default_value("a.cstr"))
}